

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O3

int32_t icu_63::BytesTrie::readValue(uint8_t *pos,int32_t leadByte)

{
  uint uVar1;
  uint uVar2;
  
  if (leadByte < 0x51) {
    return leadByte + -0x10;
  }
  if ((uint)leadByte < 0x6c) {
    return leadByte * 0x100 + (uint)*pos + -0x5100;
  }
  if ((uint)leadByte < 0x7e) {
    return (uint)pos[1] + ((uint)*pos << 8 | leadByte << 0x10) + -0x6c0000;
  }
  uVar2 = (uint)pos[2];
  if (leadByte == 0x7e) {
    uVar1 = (uint)pos[1] << 8 | (uint)*pos << 0x10;
  }
  else {
    uVar2 = (uint)pos[2] << 8 | (uint)pos[1] << 0x10 | (uint)*pos << 0x18;
    uVar1 = (uint)pos[3];
  }
  return uVar1 | uVar2;
}

Assistant:

int32_t
BytesTrie::readValue(const uint8_t *pos, int32_t leadByte) {
    int32_t value;
    if(leadByte<kMinTwoByteValueLead) {
        value=leadByte-kMinOneByteValueLead;
    } else if(leadByte<kMinThreeByteValueLead) {
        value=((leadByte-kMinTwoByteValueLead)<<8)|*pos;
    } else if(leadByte<kFourByteValueLead) {
        value=((leadByte-kMinThreeByteValueLead)<<16)|(pos[0]<<8)|pos[1];
    } else if(leadByte==kFourByteValueLead) {
        value=(pos[0]<<16)|(pos[1]<<8)|pos[2];
    } else {
        value=(pos[0]<<24)|(pos[1]<<16)|(pos[2]<<8)|pos[3];
    }
    return value;
}